

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O3

void cjson_create_array_reference_should_create_an_array_reference(void)

{
  cJSON *item;
  cJSON *pcVar1;
  cJSON *pcVar2;
  cJSON *pcVar3;
  
  item = (cJSON *)(*global_hooks.allocate)(0x40);
  if (item != (cJSON *)0x0) {
    item->child = (cJSON *)0x0;
    *(undefined8 *)&item->type = 0;
    item->valuedouble = 0.0;
    item->string = (char *)0x0;
    item->valuestring = (char *)0x0;
    *(undefined8 *)&item->valueint = 0;
    item->next = (cJSON *)0x0;
    item->prev = (cJSON *)0x0;
    item->type = 0x20;
  }
  pcVar1 = (cJSON *)(*global_hooks.allocate)(0x40);
  if (pcVar1 == (cJSON *)0x0) {
    UnityFail(" Expected TRUE Was FALSE",0x209);
  }
  else {
    pcVar1->child = (cJSON *)0x0;
    *(undefined8 *)&pcVar1->type = 0;
    pcVar1->valuedouble = 0.0;
    pcVar1->string = (char *)0x0;
    pcVar1->valuestring = (char *)0x0;
    *(undefined8 *)&pcVar1->valueint = 0;
    pcVar1->next = (cJSON *)0x0;
    pcVar1->prev = (cJSON *)0x0;
    pcVar1->type = 8;
    pcVar1->valuedouble = 42.0;
    pcVar1->valueint = 0x2a;
  }
  if ((item == (cJSON *)0x0) || ((char)item->type != ' ')) {
    UnityFail(" Expected TRUE Was FALSE",0x20a);
  }
  if (item != (cJSON *)0x0 && pcVar1 != (cJSON *)0x0) {
    pcVar3 = item->child;
    if (item->child == (cJSON *)0x0) {
      item->child = pcVar1;
    }
    else {
      do {
        pcVar2 = pcVar3;
        pcVar3 = pcVar2->next;
      } while (pcVar2->next != (cJSON *)0x0);
      pcVar2->next = pcVar1;
      pcVar1->prev = pcVar2;
    }
  }
  pcVar3 = (cJSON *)(*global_hooks.allocate)(0x40);
  if (pcVar3 == (cJSON *)0x0) {
    if (_DAT_00000010 != pcVar1) {
      UnityFail(" Expected TRUE Was FALSE",0x20e);
    }
  }
  else {
    pcVar3->child = (cJSON *)0x0;
    *(undefined8 *)&pcVar3->type = 0;
    pcVar3->valuedouble = 0.0;
    pcVar3->string = (char *)0x0;
    pcVar3->valuestring = (char *)0x0;
    *(undefined8 *)&pcVar3->valueint = 0;
    pcVar3->next = (cJSON *)0x0;
    pcVar3->prev = (cJSON *)0x0;
    pcVar3->type = 0x120;
    pcVar3->child = pcVar1;
  }
  UnityAssertEqualNumber(0x120,(long)pcVar3->type,(char *)0x0,0x20f,UNITY_DISPLAY_STYLE_INT);
  cJSON_Delete(item);
  cJSON_Delete(pcVar3);
  return;
}

Assistant:

static void cjson_create_array_reference_should_create_an_array_reference(void) {
    cJSON *number_reference = NULL;
    cJSON *number_array = cJSON_CreateArray();
    cJSON *number = cJSON_CreateNumber(42);

    TEST_ASSERT_TRUE(cJSON_IsNumber(number));
    TEST_ASSERT_TRUE(cJSON_IsArray(number_array));
    cJSON_AddItemToArray(number_array, number);

    number_reference = cJSON_CreateArrayReference(number);
    TEST_ASSERT_TRUE(number_reference->child == number);
    TEST_ASSERT_EQUAL_INT(cJSON_Array | cJSON_IsReference, number_reference->type);

    cJSON_Delete(number_array);
    cJSON_Delete(number_reference);
}